

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Index * sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,
                          ExprList *pList,int onError,Token *pStart,Expr *pPIWhere,int sortOrder,
                          int ifNotExist)

{
  sqlite3 *db_00;
  Db *pDVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Table *pTVar5;
  Index *pIVar6;
  char *pcVar7;
  Expr *pEVar8;
  CollSeq *pCVar9;
  void *pvVar10;
  Vdbe *pVVar11;
  long in_RCX;
  long lVar12;
  long in_RDX;
  Parse *in_RDI;
  ExprList *in_R8;
  int in_R9D;
  bool bVar13;
  long in_stack_00000008;
  Expr *in_stack_00000010;
  u8 in_stack_00000018;
  int in_stack_00000020;
  Index *pOther;
  int n_1;
  int iMem;
  char *zStmt;
  Vdbe *v;
  Index *p;
  char *z2;
  char *z1;
  int k;
  Index *pIdx;
  int x;
  int nColl;
  char *zColl;
  int requestedSortOrder;
  char *zColName;
  Expr *pExpr;
  char *zDb;
  Index *pLoop;
  int n;
  Index *pPk;
  char *zExtra;
  int nExtraCol;
  int nExtra;
  Column *pTabCol;
  ExprList_item *pListItem;
  Token *pName;
  int iDb;
  Db *pDb;
  sqlite3 *db;
  int sortOrderMask;
  DbFixer sFix;
  int j;
  int i;
  int nName;
  char *zName;
  Index *pIndex;
  Table *pTab;
  Index *pRet;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  sqlite3 *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  Parse *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  Parse *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  Hash *in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffed4;
  Index *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  Expr *local_118;
  Index *local_f0;
  uint local_e4;
  Index *pList_00;
  char *pcVar14;
  int iVar15;
  Table *in_stack_ffffffffffffff38;
  Column *pCVar16;
  Parse *in_stack_ffffffffffffff40;
  ExprList_item *pEVar17;
  Token *pName_00;
  byte local_94;
  DbFixer local_90;
  int local_5c;
  int local_58;
  int local_54;
  char *local_50;
  Index *local_48;
  Table *local_40;
  Index *local_38;
  int local_2c;
  ExprList *local_28;
  long local_20;
  
  local_38 = (Index *)0x0;
  local_40 = (Table *)0x0;
  local_48 = (Index *)0x0;
  local_50 = (char *)0x0;
  db_00 = in_RDI->db;
  pName_00 = (Token *)0x0;
  iVar15 = 0;
  pcVar14 = (char *)0x0;
  pList_00 = (Index *)0x0;
  pIVar6 = local_38;
  local_28 = in_R8;
  if (((db_00->mallocFailed != '\0') || (in_RDI->declareVtab != '\0')) ||
     (local_2c = in_R9D, local_20 = in_RCX,
     iVar2 = sqlite3ReadSchema((Parse *)in_stack_fffffffffffffe70), pIVar6 = local_38, iVar2 != 0))
  goto LAB_001672ea;
  if (local_20 == 0) {
    local_40 = in_RDI->pNewTable;
    if (local_40 == (Table *)0x0) goto LAB_001672ea;
    iVar2 = sqlite3SchemaToIndex(db_00,local_40->pSchema);
  }
  else {
    iVar2 = sqlite3TwoPartName(in_stack_fffffffffffffe88,
                               (Token *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80
                                                ),
                               (Token *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ),(Token **)in_stack_fffffffffffffe70);
    pIVar6 = local_38;
    if (iVar2 < 0) goto LAB_001672ea;
    if ((((db_00->init).busy == '\0') &&
        (local_40 = sqlite3SrcListLookup
                              ((Parse *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80
                                                ),
                               (SrcList *)
                               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),
        *(int *)(in_RDX + 8) == 0)) &&
       ((local_40 != (Table *)0x0 && (local_40->pSchema == db_00->aDb[1].pSchema)))) {
      iVar2 = 1;
    }
    sqlite3FixInit(&local_90,in_RDI,iVar2,"index",pName_00);
    sqlite3FixSrcList((DbFixer *)in_stack_fffffffffffffe88,
                      (SrcList *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
    local_40 = sqlite3LocateTableItem
                         ((Parse *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                          in_stack_fffffffffffffe7c,(SrcList_item *)in_stack_fffffffffffffe70);
    pIVar6 = local_38;
    if (local_40 == (Table *)0x0) goto LAB_001672ea;
    if ((iVar2 == 1) && (db_00->aDb[1].pSchema != local_40->pSchema)) {
      sqlite3ErrorMsg(in_RDI,"cannot create a TEMP index on non-TEMP table \"%s\"",local_40->zName);
      pIVar6 = local_38;
      goto LAB_001672ea;
    }
    if ((local_40->tabFlags & 0x20) != 0) {
      pList_00 = sqlite3PrimaryKeyIndex(local_40);
    }
  }
  pDVar1 = db_00->aDb;
  lVar12 = (long)iVar2;
  iVar3 = sqlite3_strnicmp(local_40->zName,"sqlite_",7);
  if (((iVar3 == 0) && ((db_00->init).busy == '\0')) &&
     (iVar3 = sqlite3_strnicmp(local_40->zName + 7,"altertab_",9), iVar3 != 0)) {
    sqlite3ErrorMsg(in_RDI,"table %s may not be indexed",local_40->zName);
    pIVar6 = local_38;
  }
  else if (local_40->pSelect == (Select *)0x0) {
    if ((local_40->tabFlags & 0x10) == 0) {
      if (pName_00 == (Token *)0x0) {
        local_f0 = local_40->pIndex;
        local_e4 = 1;
        for (; local_f0 != (Index *)0x0; local_f0 = local_f0->pNext) {
          local_e4 = local_e4 + 1;
        }
        local_50 = sqlite3MPrintf(db_00,"sqlite_autoindex_%s_%d",local_40->zName,(ulong)local_e4);
        pIVar6 = local_38;
        if (local_50 == (char *)0x0) goto LAB_001672ea;
      }
      else {
        local_50 = sqlite3NameFromToken
                             (in_stack_fffffffffffffe70,
                              (Token *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                             );
        pIVar6 = local_38;
        if ((local_50 == (char *)0x0) ||
           (iVar3 = sqlite3CheckObjectName
                              ((Parse *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68
                                                ),(char *)0x1662fd), pIVar6 = local_38, iVar3 != 0))
        goto LAB_001672ea;
        if (((db_00->init).busy == '\0') &&
           (pTVar5 = sqlite3FindTable((sqlite3 *)
                                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                      (char *)in_stack_fffffffffffffe88,
                                      (char *)CONCAT17(in_stack_fffffffffffffe87,
                                                       in_stack_fffffffffffffe80)),
           pTVar5 != (Table *)0x0)) {
          sqlite3ErrorMsg(in_RDI,"there is already a table named %s",local_50);
          pIVar6 = local_38;
          goto LAB_001672ea;
        }
        pIVar6 = sqlite3FindIndex((sqlite3 *)
                                  CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                  (char *)in_stack_fffffffffffffe88,
                                  (char *)CONCAT17(in_stack_fffffffffffffe87,
                                                   in_stack_fffffffffffffe80));
        if (pIVar6 != (Index *)0x0) {
          if (in_stack_00000020 == 0) {
            sqlite3ErrorMsg(in_RDI,"index %s already exists",local_50);
            pIVar6 = local_38;
          }
          else {
            sqlite3CodeVerifySchema
                      ((Parse *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe7c);
            pIVar6 = local_38;
          }
          goto LAB_001672ea;
        }
      }
      iVar3 = sqlite3AuthCheck(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                               (char *)in_stack_fffffffffffffe88,
                               (char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80)
                               ,(char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78
                                                ));
      pIVar6 = local_38;
      if (iVar3 == 0) {
        local_58 = 1;
        if (iVar2 == 1) {
          local_58 = 3;
        }
        iVar3 = sqlite3AuthCheck(in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
                                 (char *)in_stack_fffffffffffffe88,
                                 (char *)CONCAT17(in_stack_fffffffffffffe87,
                                                  in_stack_fffffffffffffe80),
                                 (char *)CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78));
        pIVar6 = local_38;
        if (iVar3 == 0) {
          if (local_28 == (ExprList *)0x0) {
            local_28 = sqlite3ExprListAppend
                                 (in_stack_fffffffffffffe88,
                                  (ExprList *)
                                  CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                                  (Expr *)CONCAT44(in_stack_fffffffffffffe7c,
                                                   in_stack_fffffffffffffe78));
            pIVar6 = local_38;
            if (local_28 == (ExprList *)0x0) goto LAB_001672ea;
            pcVar7 = sqlite3DbStrDup((sqlite3 *)
                                     CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                     (char *)in_stack_fffffffffffffe70);
            local_28->a->zName = pcVar7;
            local_28->a->sortOrder = in_stack_00000018;
          }
          for (local_58 = 0; local_58 < local_28->nExpr; local_58 = local_58 + 1) {
            pEVar8 = local_28->a[local_58].pExpr;
            if (pEVar8 != (Expr *)0x0) {
              iVar3 = sqlite3Strlen30((pEVar8->u).zToken);
              iVar15 = iVar3 + 1 + iVar15;
            }
          }
          local_54 = sqlite3Strlen30(local_50);
          if (pList_00 == (Index *)0x0) {
            uVar4 = 1;
          }
          else {
            uVar4 = (uint)pList_00->nKeyCol;
          }
          local_48 = sqlite3AllocateIndexObject
                               ((sqlite3 *)CONCAT44(uVar4,in_stack_fffffffffffffe90),
                                (i16)((ulong)in_stack_fffffffffffffe88 >> 0x30),
                                (int)in_stack_fffffffffffffe88,
                                (char **)CONCAT17(in_stack_fffffffffffffe87,
                                                  in_stack_fffffffffffffe80));
          pIVar6 = local_38;
          if (db_00->mallocFailed == '\0') {
            local_48->zName = pcVar14;
            pEVar8 = (Expr *)(pcVar14 + (local_54 + 1));
            memcpy(local_48->zName,local_50,(long)(local_54 + 1));
            local_48->pTable = local_40;
            local_48->onError = (u8)local_2c;
            local_48->field_0x5b = local_48->field_0x5b & 0xf7 | (local_2c != 0) << 3;
            local_48->field_0x5b = local_48->field_0x5b & 0xfc | pName_00 == (Token *)0x0;
            local_48->pSchema = db_00->aDb[iVar2].pSchema;
            local_48->nKeyCol = (u16)local_28->nExpr;
            if (in_stack_00000010 != (Expr *)0x0) {
              sqlite3ResolveSelfReference
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,iVar15,pEVar8,
                         (ExprList *)pList_00);
              local_48->pPartIdxWhere = in_stack_00000010;
            }
            if ((pDVar1[lVar12].pSchema)->file_format < 4) {
              local_94 = 0;
            }
            else {
              local_94 = 0xff;
            }
            local_58 = 0;
            pEVar17 = local_28->a;
            for (; local_58 < local_28->nExpr; local_58 = local_58 + 1) {
              pcVar14 = pEVar17->zName;
              local_5c = 0;
              pCVar16 = local_40->aCol;
              while ((local_5c < local_40->nCol &&
                     (iVar15 = sqlite3_stricmp(pcVar14,pCVar16->zName), iVar15 != 0))) {
                local_5c = local_5c + 1;
                pCVar16 = pCVar16 + 1;
              }
              if (local_40->nCol <= local_5c) {
                sqlite3ErrorMsg(in_RDI,"table %s has no column named %s",local_40->zName,pcVar14);
                in_RDI->checkSchema = '\x01';
                pIVar6 = local_38;
                goto LAB_001672ea;
              }
              local_48->aiColumn[local_58] = (i16)local_5c;
              if (pEVar17->pExpr == (Expr *)0x0) {
                local_118 = (Expr *)local_40->aCol[local_5c].zColl;
                if (local_118 == (Expr *)0x0) {
                  local_118 = (Expr *)0x1dfad3;
                }
              }
              else {
                pcVar14 = (pEVar17->pExpr->u).zToken;
                in_stack_fffffffffffffee4 = sqlite3Strlen30(pcVar14);
                in_stack_fffffffffffffee4 = in_stack_fffffffffffffee4 + 1;
                local_118 = pEVar8;
                memcpy(pEVar8,pcVar14,(long)in_stack_fffffffffffffee4);
                pEVar8 = (Expr *)(&local_118->op + in_stack_fffffffffffffee4);
              }
              if (((db_00->init).busy == '\0') &&
                 (pCVar9 = sqlite3LocateCollSeq
                                     ((Parse *)CONCAT17(in_stack_fffffffffffffe87,
                                                        in_stack_fffffffffffffe80),
                                      (char *)CONCAT44(in_stack_fffffffffffffe7c,
                                                       in_stack_fffffffffffffe78)),
                 pIVar6 = local_38, pCVar9 == (CollSeq *)0x0)) goto LAB_001672ea;
              local_48->azColl[local_58] = (char *)local_118;
              local_48->aSortOrder[local_58] = pEVar17->sortOrder & local_94;
              if (local_40->aCol[local_5c].notNull == '\0') {
                local_48->field_0x5b = local_48->field_0x5b & 0xf7;
              }
              pEVar17 = pEVar17 + 1;
            }
            if (pList_00 == (Index *)0x0) {
              local_48->aiColumn[local_58] = -1;
              local_48->azColl[local_58] = "BINARY";
            }
            else {
              for (local_5c = 0; local_5c < (int)(uint)pList_00->nKeyCol; local_5c = local_5c + 1) {
                in_stack_fffffffffffffee0 = (int)pList_00->aiColumn[local_5c];
                iVar15 = hasColumn(local_48->aiColumn,(uint)local_48->nKeyCol,
                                   in_stack_fffffffffffffee0);
                if (iVar15 == 0) {
                  local_48->aiColumn[local_58] = (i16)in_stack_fffffffffffffee0;
                  local_48->azColl[local_58] = pList_00->azColl[local_5c];
                  local_48->aSortOrder[local_58] = pList_00->aSortOrder[local_5c];
                  local_58 = local_58 + 1;
                }
                else {
                  local_48->nColumn = local_48->nColumn - 1;
                }
              }
            }
            sqlite3DefaultRowEst((Index *)CONCAT44(uVar4,in_stack_fffffffffffffe90));
            if (in_RDI->pNewTable == (Table *)0x0) {
              estimateIndexWidth((Index *)CONCAT17(in_stack_fffffffffffffe87,
                                                   in_stack_fffffffffffffe80));
            }
            if (local_40 == in_RDI->pNewTable) {
              for (pIVar6 = local_40->pIndex; pIVar6 != (Index *)0x0; pIVar6 = pIVar6->pNext) {
                if (pIVar6->nKeyCol == local_48->nKeyCol) {
                  for (in_stack_fffffffffffffed4 = 0;
                      ((int)in_stack_fffffffffffffed4 < (int)(uint)pIVar6->nKeyCol &&
                      (pIVar6->aiColumn[(int)in_stack_fffffffffffffed4] ==
                       local_48->aiColumn[(int)in_stack_fffffffffffffed4]));
                      in_stack_fffffffffffffed4 = in_stack_fffffffffffffed4 + 1) {
                    if ((pIVar6->azColl[(int)in_stack_fffffffffffffed4] !=
                         local_48->azColl[(int)in_stack_fffffffffffffed4]) &&
                       (iVar15 = sqlite3_stricmp(pIVar6->azColl[(int)in_stack_fffffffffffffed4],
                                                 local_48->azColl[(int)in_stack_fffffffffffffed4]),
                       iVar15 != 0)) break;
                  }
                  if (in_stack_fffffffffffffed4 == pIVar6->nKeyCol) {
                    if (pIVar6->onError != local_48->onError) {
                      if ((pIVar6->onError != '\n') && (local_48->onError != '\n')) {
                        sqlite3ErrorMsg(in_RDI,"conflicting ON CONFLICT clauses specified",0);
                      }
                      if (pIVar6->onError == '\n') {
                        pIVar6->onError = local_48->onError;
                      }
                    }
                    goto LAB_001672ea;
                  }
                }
              }
              in_stack_fffffffffffffed8 = (Index *)0x0;
            }
            if ((db_00->init).busy == '\0') {
              if ((in_RDI->nErr == 0) && (((local_40->tabFlags & 0x20) == 0 || (local_20 != 0)))) {
                iVar15 = in_RDI->nMem + 1;
                in_RDI->nMem = iVar15;
                pVVar11 = sqlite3GetVdbe((Parse *)in_stack_fffffffffffffe70);
                pIVar6 = local_38;
                if (pVVar11 == (Vdbe *)0x0) goto LAB_001672ea;
                sqlite3BeginWriteOperation
                          ((Parse *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
                sqlite3VdbeAddOp2((Vdbe *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                  in_stack_fffffffffffffe68,0);
                if (in_stack_00000008 == 0) {
                  in_stack_fffffffffffffe70 = (sqlite3 *)0x0;
                  in_stack_fffffffffffffe68 = iVar15;
                }
                else {
                  uVar4 = ((int)(in_RDI->sLastToken).z - (int)pName_00->z) + (in_RDI->sLastToken).n;
                  if (pName_00->z[(int)(uVar4 - 1)] == ';') {
                    uVar4 = uVar4 - 1;
                  }
                  pcVar14 = " UNIQUE";
                  if (local_2c == 0) {
                    pcVar14 = "";
                  }
                  in_stack_fffffffffffffe70 =
                       (sqlite3 *)
                       sqlite3MPrintf(db_00,"CREATE%s INDEX %.*s",pcVar14,(ulong)uVar4,pName_00->z);
                  in_stack_fffffffffffffe68 = iVar15;
                }
                pcVar14 = "sqlite_master";
                if (iVar2 == 1) {
                  pcVar14 = "sqlite_temp_master";
                }
                sqlite3NestedParse(in_RDI,"INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                   db_00->aDb[iVar2].zName,pcVar14,local_48->zName,local_40->zName);
                sqlite3DbFree(in_stack_fffffffffffffe70,
                              (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
                ;
                if (local_20 != 0) {
                  sqlite3RefillIndex((Parse *)CONCAT44(in_stack_fffffffffffffee4,
                                                       in_stack_fffffffffffffee0),
                                     in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
                  sqlite3ChangeCookie((Parse *)CONCAT17(in_stack_fffffffffffffe87,
                                                        in_stack_fffffffffffffe80),
                                      in_stack_fffffffffffffe7c);
                  sqlite3MPrintf(db_00,"name=\'%q\' AND type=\'index\'",local_48->zName);
                  sqlite3VdbeAddParseSchemaOp
                            ((Vdbe *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                             in_stack_fffffffffffffe7c,(char *)in_stack_fffffffffffffe70);
                  sqlite3VdbeAddOp1((Vdbe *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                                    in_stack_fffffffffffffe68);
                }
              }
            }
            else {
              pvVar10 = sqlite3HashInsert(in_stack_fffffffffffffea8,
                                          (char *)CONCAT44(in_stack_fffffffffffffea4,
                                                           in_stack_fffffffffffffea0),
                                          in_stack_fffffffffffffe98);
              if (pvVar10 != (void *)0x0) {
                db_00->mallocFailed = '\x01';
                pIVar6 = local_38;
                goto LAB_001672ea;
              }
              db_00->flags = db_00->flags | 2;
              if (local_20 != 0) {
                local_48->tnum = (db_00->init).newTnum;
              }
            }
            if (((db_00->init).busy != '\0') || (pIVar6 = local_38, local_20 == 0)) {
              if ((local_2c == 5) &&
                 ((local_40->pIndex != (Index *)0x0 && (local_40->pIndex->onError != '\x05')))) {
                pIVar6 = local_40->pIndex;
                while( true ) {
                  bVar13 = false;
                  if (pIVar6->pNext != (Index *)0x0) {
                    bVar13 = pIVar6->pNext->onError != '\x05';
                  }
                  if (!bVar13) break;
                  pIVar6 = pIVar6->pNext;
                }
                local_48->pNext = pIVar6->pNext;
                pIVar6->pNext = local_48;
                in_stack_fffffffffffffe87 = 0;
              }
              else {
                local_48->pNext = local_40->pIndex;
                local_40->pIndex = local_48;
              }
              local_38 = local_48;
              local_48 = (Index *)0x0;
              pIVar6 = local_38;
            }
          }
        }
      }
    }
    else {
      sqlite3ErrorMsg(in_RDI,"virtual tables may not be indexed");
      pIVar6 = local_38;
    }
  }
  else {
    sqlite3ErrorMsg(in_RDI,"views may not be indexed");
    pIVar6 = local_38;
  }
LAB_001672ea:
  local_38 = pIVar6;
  if (local_48 != (Index *)0x0) {
    freeIndex(in_stack_fffffffffffffe70,
              (Index *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  }
  sqlite3ExprDelete(in_stack_fffffffffffffe70,
                    (Expr *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  sqlite3ExprListDelete
            ((sqlite3 *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (ExprList *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  sqlite3SrcListDelete
            ((sqlite3 *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (SrcList *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  sqlite3DbFree(in_stack_fffffffffffffe70,
                (void *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  return local_38;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist     /* Omit error if index already exists */
){
  Index *pRet = 0;     /* Pointer to return */
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  const Column *pTabCol;           /* A column in the table */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  assert( pParse->nErr==0 );      /* Never called with prior errors */
  if( db->mallocFailed || IN_DECLARE_VTAB ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
       && sqlite3StrNICmp(&pTab->zName[7],"altertab_",9)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !db->init.busy ){
      if( sqlite3FindTable(db, zName, 0)!=0 ){
        sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
        goto exit_create_index;
      }
    }
    if( sqlite3FindIndex(db, zName, pDb->zName)!=0 ){
      if( !ifNotExist ){
        sqlite3ErrorMsg(pParse, "index %s already exists", zName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto exit_create_index;
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    const char *zDb = pDb->zName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    pList = sqlite3ExprListAppend(pParse, 0, 0);
    if( pList==0 ) goto exit_create_index;
    pList->a[0].zName = sqlite3DbStrDup(pParse->db,
                                        pTab->aCol[pTab->nCol-1].zName);
    pList->a[0].sortOrder = (u8)sortOrder;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    if( pExpr ){
      assert( pExpr->op==TK_COLLATE );
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = pName ? SQLITE_IDXTYPE_APPDEF : SQLITE_IDXTYPE_UNIQUE;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Scan the names of the columns of the table to be indexed and
  ** load the column indices into the Index structure.  Report an error
  ** if any column is not found.
  **
  ** TODO:  Add a test to make sure that the same column is not named
  ** more than once within the same index.  Only the first instance of
  ** the column will ever be used by the optimizer.  Note that using the
  ** same column more than once cannot be an error because that would 
  ** break backwards compatibility - it needs to be a warning.
  */
  for(i=0, pListItem=pList->a; i<pList->nExpr; i++, pListItem++){
    const char *zColName = pListItem->zName;
    int requestedSortOrder;
    char *zColl;                   /* Collation sequence name */

    for(j=0, pTabCol=pTab->aCol; j<pTab->nCol; j++, pTabCol++){
      if( sqlite3StrICmp(zColName, pTabCol->zName)==0 ) break;
    }
    if( j>=pTab->nCol ){
      sqlite3ErrorMsg(pParse, "table %s has no column named %s",
        pTab->zName, zColName);
      pParse->checkSchema = 1;
      goto exit_create_index;
    }
    assert( j<=0x7fff );
    pIndex->aiColumn[i] = (i16)j;
    if( pListItem->pExpr ){
      int nColl;
      assert( pListItem->pExpr->op==TK_COLLATE );
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else{
      zColl = pTab->aCol[j].zColl;
      if( !zColl ) zColl = "BINARY";
    }
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
    if( pTab->aCol[j].notNull==0 ) pIndex->uniqNotNull = 0;
  }
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = -1;
    pIndex->azColl[i] = "BINARY";
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( z1!=z2 && sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        pRet = pIdx;
        goto exit_create_index;
      }
    }
  }

  /* Link the new Index structure to its table and to the other
  ** in-memory database structures. 
  */
  if( db->init.busy ){
    Index *p;
    assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
    p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
                          pIndex->zName, pIndex);
    if( p ){
      assert( p==pIndex );  /* Malloc must have failed */
      db->mallocFailed = 1;
      goto exit_create_index;
    }
    db->flags |= SQLITE_InternChanges;
    if( pTblName!=0 ){
      pIndex->tnum = db->init.newTnum;
    }
  }

  /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
  ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
  ** emit code to allocate the index rootpage on disk and make an entry for
  ** the index in the sqlite_master table and populate the index with
  ** content.  But, do not do this if we are simply reading the sqlite_master
  ** table to parse the schema, or if this index is the PRIMARY KEY index
  ** of a WITHOUT ROWID table.
  **
  ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
  ** or UNIQUE index in a CREATE TABLE statement.  Since the table
  ** has just been created, it contains no data and the index initialization
  ** step can be skipped.
  */
  else if( pParse->nErr==0 && (HasRowid(pTab) || pTblName!=0) ){
    Vdbe *v;
    char *zStmt;
    int iMem = ++pParse->nMem;

    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto exit_create_index;


    /* Create the rootpage for the index
    */
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3VdbeAddOp2(v, OP_CreateIndex, iDb, iMem);

    /* Gather the complete text of the CREATE INDEX statement into
    ** the zStmt variable
    */
    if( pStart ){
      int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
      if( pName->z[n-1]==';' ) n--;
      /* A named index with an explicit CREATE INDEX statement */
      zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
        onError==OE_None ? "" : " UNIQUE", n, pName->z);
    }else{
      /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
      /* zStmt = sqlite3MPrintf(""); */
      zStmt = 0;
    }

    /* Add an entry in sqlite_master for this index
    */
    sqlite3NestedParse(pParse, 
        "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
        db->aDb[iDb].zName, SCHEMA_TABLE(iDb),
        pIndex->zName,
        pTab->zName,
        iMem,
        zStmt
    );
    sqlite3DbFree(db, zStmt);

    /* Fill the index with data and reparse the schema. Code an OP_Expire
    ** to invalidate all pre-compiled statements.
    */
    if( pTblName ){
      sqlite3RefillIndex(pParse, pIndex, iMem);
      sqlite3ChangeCookie(pParse, iDb);
      sqlite3VdbeAddParseSchemaOp(v, iDb,
         sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
      sqlite3VdbeAddOp1(v, OP_Expire, 0);
    }
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pRet = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) freeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
  return pRet;
}